

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O0

float __thiscall
Rml::Box::GetSizeAcross(Box *this,BoxDirection direction,BoxArea area_outer,BoxArea area_inner)

{
  code *pcVar1;
  bool bVar2;
  float local_34;
  BoxArea local_24;
  float local_20;
  int i;
  float size;
  BoxArea area_inner_local;
  BoxArea area_outer_local;
  BoxDirection direction_local;
  Box *this_local;
  
  if (((((int)area_inner < (int)area_outer) || (1 < (int)direction)) || (area_inner == Auto)) &&
     (bVar2 = Assert("RMLUI_ASSERT((int)area_outer <= (int)area_inner && (int)direction <= 1 && area_inner != BoxArea::Auto)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                     ,0x65), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_20 = 0.0;
  local_24 = area_outer;
  if (area_inner == Content) {
    if (direction == Horizontal) {
      local_34 = (this->content).x;
    }
    else {
      local_34 = (this->content).y;
    }
    local_20 = local_34;
  }
  for (; (int)local_24 <= (int)area_inner && (int)local_24 < 3; local_24 = local_24 + Border) {
    local_20 = this->area_edges[(int)local_24][(int)direction] +
               this->area_edges[(int)local_24][(int)(direction + 2)] + local_20;
  }
  return local_20;
}

Assistant:

float Box::GetSizeAcross(BoxDirection direction, BoxArea area_outer, BoxArea area_inner) const
{
	static_assert((int)BoxDirection::Horizontal == 1 && (int)BoxDirection::Vertical == 0, "");
	RMLUI_ASSERT((int)area_outer <= (int)area_inner && (int)direction <= 1 && area_inner != BoxArea::Auto);

	float size = 0.0f;

	if (area_inner == BoxArea::Content)
		size = (direction == BoxDirection::Horizontal ? content.x : content.y);

	for (int i = (int)area_outer; i <= (int)area_inner && i < (int)BoxArea::Content; i++)
		size += (area_edges[i][(int)BoxEdge::Top + (int)direction] + area_edges[i][(int)BoxEdge::Bottom + (int)direction]);

	return size;
}